

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhsts.cpp
# Opt level: O1

bool __thiscall QHstsHeaderParser::parseSTSHeader(QHstsHeaderParser *this)

{
  char *pcVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  long in_FS_OFFSET;
  char *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  QDateTime::QDateTime((QDateTime *)&local_38);
  pcVar1 = *(char **)&this->expiry;
  *(char **)&this->expiry = local_38;
  local_38 = pcVar1;
  QDateTime::~QDateTime((QDateTime *)&local_38);
  this->maxAgeFound = false;
  this->subDomainsFound = false;
  this->maxAge = 0;
  this->tokenPos = 0;
  QByteArray::clear();
  lVar2 = (this->header).d.size;
  bVar4 = lVar2 <= this->tokenPos;
  if ((this->tokenPos < lVar2) && (bVar3 = parseDirective(this), bVar3)) {
    do {
      if ((this->token).d.size != 0) {
        local_38 = ";";
        bVar3 = operator!=(&this->token,&local_38);
        if (bVar3) break;
      }
      lVar2 = (this->header).d.size;
      bVar4 = lVar2 <= this->tokenPos;
      if ((lVar2 <= this->tokenPos) || (bVar3 = parseDirective(this), !bVar3)) break;
    } while( true );
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return bVar4;
}

Assistant:

bool QHstsHeaderParser::parseSTSHeader()
{
    expiry = QDateTime();
    maxAgeFound = false;
    subDomainsFound = false;
    maxAge = 0;
    tokenPos = 0;
    token.clear();

    while (tokenPos < header.size()) {
        if (!parseDirective())
            return false;

        if (token.size() && token != ";") {
            // After a directive we can only have a ";" or no more tokens.
            // Invalid syntax.
            return false;
        }
    }

    return true;
}